

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O1

void fs_add_serializer_metainfo_f(void *serializer,char *name,int name_length,float value)

{
  float local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + name_length);
  local_3c = value;
  ser::MetainfoSet::AddMetainfo<float>((MetainfoSet *)((long)serializer + 0x10),&local_38,&local_3c)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void fs_add_serializer_metainfo_f(void* serializer, const char* name, int name_length,  float value)
{
    reinterpret_cast<Serializer*>(serializer)->AddMetainfo(std::string(name, name_length), value);
}